

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_btGetAllMatches_extDict_5
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  U32 *pUVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uint *puVar8;
  BYTE *pBVar9;
  BYTE *in_RCX;
  ZSTD_matchState_t *in_RDX;
  ZSTD_matchState_t *in_RSI;
  int *in_RDI;
  BYTE *in_R8;
  int *in_R9;
  uint in_stack_00000008;
  int in_stack_00000010;
  U32 forward;
  U32 idx;
  U32 target;
  BYTE *base;
  BYTE *match_3;
  size_t matchLength_1;
  U32 *nextPtr_1;
  U32 *dmsBt;
  U32 dictMatchIndex;
  size_t dmsH;
  size_t matchLength;
  BYTE *match_2;
  U32 *nextPtr;
  BYTE *match_1;
  BYTE *match;
  size_t mlen;
  U32 matchIndex3;
  BYTE *repMatch;
  U32 repLen;
  U32 repIndex;
  U32 repOffset;
  U32 repCode;
  U32 lastR;
  size_t bestLength;
  U32 dmsBtLow;
  U32 dmsBtMask;
  U32 dmsBtLog;
  U32 dmsHashLog;
  U32 dmsIndexDelta;
  U32 dmsLowLimit;
  U32 dmsHighLimit;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  ZSTD_compressionParameters *dmsCParams;
  ZSTD_matchState_t *dms;
  U32 nbCompares;
  U32 mnum;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 matchLow;
  U32 windowLow;
  U32 btLow;
  BYTE *prefixStart;
  BYTE *dictEnd;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 matchIndex;
  size_t h;
  U32 *hashTable;
  U32 minMatch;
  U32 hashLog;
  U32 curr;
  BYTE *base_1;
  U32 sufficient_len;
  ZSTD_compressionParameters *cParams;
  undefined4 in_stack_fffffffffffffca8;
  U32 in_stack_fffffffffffffcac;
  void *in_stack_fffffffffffffcb0;
  BYTE *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined1 uVar10;
  U32 in_stack_fffffffffffffcd8;
  U32 in_stack_fffffffffffffcdc;
  BYTE *in_stack_fffffffffffffce0;
  U32 in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  uint uVar11;
  uint uVar12;
  uint local_308;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  BYTE *local_2e8;
  ZSTD_matchState_t *local_2d8;
  U32 local_2d0;
  uint local_2cc;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  BYTE *iend;
  BYTE *ip_00;
  uint local_238;
  BYTE *local_208;
  uint local_1e4;
  BYTE *local_1d8;
  BYTE *local_1d0;
  BYTE *local_1b0;
  uint local_194;
  uint local_188;
  BYTE *local_180;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint *local_128;
  uint *local_120;
  U32 local_114;
  U32 local_110;
  uint local_10c;
  BYTE *local_108;
  BYTE *local_100;
  uint local_f4;
  BYTE *local_f0;
  BYTE *local_e8;
  BYTE *local_e0;
  uint local_d8;
  int local_d4;
  U32 *local_d0;
  uint local_c4;
  size_t local_c0;
  U32 *local_b8;
  int local_ac;
  uint local_a8;
  uint local_a4;
  BYTE *local_a0;
  uint local_94;
  ZSTD_compressionParameters *local_90;
  uint local_84;
  int local_80;
  uint local_7c;
  int *local_78;
  int local_6c;
  BYTE *local_68;
  BYTE *local_60;
  ZSTD_matchState_t *local_50;
  int *local_48;
  uint local_38;
  uint local_34;
  BYTE *local_30;
  size_t local_28;
  undefined4 local_20;
  uint local_1c;
  size_t local_10;
  
  if ((in_RSI->cParams).minMatch < 6) {
    local_2b4 = (in_RSI->cParams).minMatch;
  }
  else {
    local_2b4 = 6;
  }
  if (local_2b4 < 3) {
    local_2b8 = 3;
  }
  else {
    if ((in_RSI->cParams).minMatch < 6) {
      local_2bc = (in_RSI->cParams).minMatch;
    }
    else {
      local_2bc = 6;
    }
    local_2b8 = local_2bc;
  }
  if (local_2b8 != 5) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  if (in_RCX < (in_RSI->window).base + in_RSI->nextToUpdate) {
    return 0;
  }
  pBVar9 = (in_RSI->window).base;
  uVar2 = (int)in_RCX - (int)pBVar9;
  iend = in_R8;
  ip_00 = in_RCX;
  for (local_238 = in_RSI->nextToUpdate; local_238 < uVar2; local_238 = UVar3 + local_238) {
    UVar3 = ZSTD_insertBt1(in_RDX,ip_00,iend,(U32)((ulong)in_R9 >> 0x20),(U32)in_R9,
                           in_stack_00000008);
    if (local_238 + UVar3 <= local_238) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if (0xffffffff < (ulong)((long)in_RCX - (long)pBVar9)) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (0xffffffff < (ulong)((long)in_R8 - (long)pBVar9)) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  in_RSI->nextToUpdate = uVar2;
  local_6c = 1;
  local_80 = in_stack_00000010;
  local_84 = 5;
  local_90 = &in_RSI->cParams;
  if ((in_RSI->cParams).targetLength < 0xfff) {
    local_2c0 = (in_RSI->cParams).targetLength;
  }
  else {
    local_2c0 = 0xfff;
  }
  local_94 = local_2c0;
  local_a0 = (in_RSI->window).base;
  local_a4 = (int)ip_00 - (int)local_a0;
  local_a8 = (in_RSI->cParams).hashLog;
  local_ac = 4;
  local_b8 = in_RSI->hashTable;
  local_20 = 5;
  local_1c = local_a8;
  if (0x20 < local_a8) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_7c = in_stack_00000008;
  local_78 = in_R9;
  local_68 = iend;
  local_60 = ip_00;
  local_50 = in_RSI;
  local_48 = in_RDI;
  switch(0x3f050b) {
  case 0:
    local_10 = ZSTD_hash4Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    break;
  case 1:
    local_10 = ZSTD_hash5Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    break;
  case 2:
    local_10 = ZSTD_hash6Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    break;
  case 3:
    local_10 = ZSTD_hash7Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    break;
  case 4:
    local_10 = ZSTD_hash8Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
  }
  local_c0 = local_10;
  local_c4 = local_b8[local_10];
  local_d0 = local_50->chainTable;
  local_d4 = local_90->chainLog - 1;
  local_d8 = (1 << ((byte)local_d4 & 0x1f)) - 1;
  local_e0 = (BYTE *)0x0;
  local_e8 = (BYTE *)0x0;
  local_f0 = (local_50->window).dictBase;
  local_f4 = (local_50->window).dictLimit;
  local_100 = local_f0 + local_f4;
  local_108 = local_a0 + local_f4;
  if (local_d8 < local_a4) {
    local_2cc = local_a4 - local_d8;
  }
  else {
    local_2cc = 0;
  }
  local_10c = local_2cc;
  local_110 = ZSTD_getLowestMatchIndex(local_50,local_a4,local_90->windowLog);
  local_2d0 = local_110;
  if (local_110 == 0) {
    local_2d0 = 1;
  }
  local_114 = local_2d0;
  local_120 = local_d0 + ((local_a4 & local_d8) << 1);
  local_128 = local_d0 + (ulong)((local_a4 & local_d8) << 1) + 1;
  local_12c = local_a4 + 9;
  local_134 = 0;
  local_138 = 1 << ((byte)local_90->searchLog & 0x1f);
  if (local_6c == 2) {
    local_2d8 = local_50->dictMatchState;
    local_2e8 = (local_2d8->window).base;
    local_2f4 = (int)(local_2d8->window).nextSrc - (int)local_2e8;
    local_2f8 = (local_2d8->window).lowLimit;
    local_2fc = local_110 - local_2f4;
    uVar2 = (local_2d8->cParams).hashLog;
    local_308 = (1 << ((char)(local_2d8->cParams).chainLog - 1U & 0x1f)) - 1;
    uVar11 = local_2f8;
    if (local_308 < local_2f4 - local_2f8) {
      uVar11 = local_2f4 - local_308;
    }
  }
  else {
    local_2d8 = (ZSTD_matchState_t *)0x0;
    local_2e8 = (BYTE *)0x0;
    local_2f4 = 0;
    local_2f8 = 0;
    local_2fc = 0;
    local_308 = 0;
    uVar11 = local_2f8;
    uVar2 = local_a8;
  }
  local_180 = (BYTE *)(ulong)(local_80 - 1);
  if (1 < local_7c) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x819e,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  uVar4 = local_7c + 3;
  uVar12 = uVar11;
  for (local_188 = local_7c; local_188 < uVar4; local_188 = local_188 + 1) {
    if (local_188 == 3) {
      iVar5 = *local_78 + -1;
    }
    else {
      iVar5 = local_78[local_188];
    }
    uVar6 = local_a4 - iVar5;
    local_194 = 0;
    if (local_a4 < local_f4) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81a5,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (iVar5 - 1U < local_a4 - local_f4) {
      in_stack_fffffffffffffcec = (uint)(local_110 <= uVar6);
      in_stack_fffffffffffffce8 =
           ZSTD_readMINMATCH((void *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),0
                            );
      UVar3 = ZSTD_readMINMATCH((void *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8
                                                ),0);
      in_stack_fffffffffffffcf0 = iVar5;
      if ((in_stack_fffffffffffffcec & in_stack_fffffffffffffce8 == UVar3) != 0) {
        sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                           in_stack_fffffffffffffce0,
                           (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        local_194 = (int)sVar7 + local_ac;
        in_stack_fffffffffffffcf0 = iVar5;
      }
    }
    else {
      if (local_6c == 2) {
        in_stack_fffffffffffffce0 = local_2e8 + ((ulong)uVar6 - (ulong)local_2fc);
      }
      else {
        in_stack_fffffffffffffce0 = local_f0 + uVar6;
      }
      if (local_a4 < local_110) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81b1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      in_stack_fffffffffffffcf0 = iVar5;
      if ((local_6c == 1) && (iVar5 - 1U < local_a4 - local_110 && 2 < (local_f4 - 1) - uVar6)) {
        in_stack_fffffffffffffcdc =
             ZSTD_readMINMATCH((void *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                               ,0);
        UVar3 = ZSTD_readMINMATCH((void *)CONCAT44(in_stack_fffffffffffffcac,
                                                   in_stack_fffffffffffffca8),0);
        if (in_stack_fffffffffffffcdc == UVar3) {
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                             in_stack_fffffffffffffce0,
                             (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                             (BYTE *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                             in_stack_fffffffffffffcc8);
          local_194 = (int)sVar7 + local_ac;
        }
      }
      if ((local_6c == 2) &&
         (iVar5 - 1U < local_a4 - (local_2f8 + local_2fc) && 2 < (local_f4 - 1) - uVar6)) {
        in_stack_fffffffffffffcd8 =
             ZSTD_readMINMATCH((void *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                               ,0);
        UVar3 = ZSTD_readMINMATCH((void *)CONCAT44(in_stack_fffffffffffffcac,
                                                   in_stack_fffffffffffffca8),0);
        if (in_stack_fffffffffffffcd8 == UVar3) {
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                             in_stack_fffffffffffffce0,
                             (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                             (BYTE *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                             in_stack_fffffffffffffcc8);
          local_194 = (int)sVar7 + local_ac;
        }
      }
    }
    if (local_180 < (BYTE *)(ulong)local_194) {
      local_180 = (BYTE *)(ulong)local_194;
      if (local_188 - local_7c == -1) {
        __assert_fail("(repCode - ll0 + 1)>=1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81c3,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (3 < (local_188 - local_7c) + 1) {
        __assert_fail("(repCode - ll0 + 1)<=ZSTD_REP_NUM",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81c3,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_48[(ulong)local_134 * 2] = (local_188 - local_7c) + 1;
      local_48[(ulong)local_134 * 2 + 1] = local_194;
      local_134 = local_134 + 1;
      if (local_94 < local_194 || local_60 + local_194 == local_68) {
        return local_134;
      }
    }
  }
  if (((local_84 == 3) && (local_180 < (BYTE *)0x3)) &&
     (UVar3 = ZSTD_insertAndFindFirstIndexHash3
                        ((ZSTD_matchState_t *)CONCAT44(uVar12,in_stack_fffffffffffffcf0),
                         (U32 *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         in_stack_fffffffffffffce0),
     local_114 <= UVar3 && local_a4 - UVar3 < 0x40000)) {
    if (((local_6c == 0) || (local_6c == 2)) || (local_f4 <= UVar3)) {
      local_1b0 = (BYTE *)ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffffcec,
                                                      in_stack_fffffffffffffce8),
                                     in_stack_fffffffffffffce0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,
                                                      in_stack_fffffffffffffcd8));
    }
    else {
      local_1b0 = (BYTE *)ZSTD_count_2segments
                                    ((BYTE *)CONCAT44(in_stack_fffffffffffffcec,
                                                      in_stack_fffffffffffffce8),
                                     in_stack_fffffffffffffce0,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,
                                                      in_stack_fffffffffffffcd8),
                                     (BYTE *)CONCAT17(in_stack_fffffffffffffcd7,
                                                      in_stack_fffffffffffffcd0),
                                     in_stack_fffffffffffffcc8);
    }
    if ((BYTE *)(ulong)local_84 <= local_1b0) {
      local_180 = local_1b0;
      if (local_a4 <= UVar3) {
        __assert_fail("curr > matchIndex3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81de,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_134 != 0) {
        __assert_fail("mnum==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81df,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_a4 == UVar3) {
        __assert_fail("(curr - matchIndex3)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81e0,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      *local_48 = (local_a4 - UVar3) + 3;
      local_48[1] = (int)local_1b0;
      local_134 = 1;
      if ((BYTE *)(ulong)local_94 < local_1b0 || local_60 + (long)local_1b0 == local_68) {
        local_50->nextToUpdate = local_a4 + 1;
        return 1;
      }
    }
  }
  local_b8[local_c0] = local_a4;
  for (; uVar10 = local_138 != 0 && local_114 <= local_c4, local_138 != 0 && local_114 <= local_c4;
      local_138 = local_138 - 1) {
    puVar8 = local_d0 + ((local_c4 & local_d8) << 1);
    local_1d8 = local_e8;
    if (local_e0 < local_e8) {
      local_1d8 = local_e0;
    }
    if (local_a4 <= local_c4) {
      __assert_fail("curr > matchIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81f1,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    in_stack_fffffffffffffcc8 = local_1d8;
    if (((local_6c == 0) || (local_6c == 2)) || ((BYTE *)(ulong)local_f4 <= local_1d8 + local_c4)) {
      if (local_1d8 + local_c4 < (BYTE *)(ulong)local_f4) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f4,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_1d0 = local_a0 + local_c4;
      if ((local_f4 <= local_c4) &&
         (iVar5 = memcmp(local_1d0,local_60,(size_t)local_1d8), iVar5 != 0)) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f6,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar7 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         in_stack_fffffffffffffce0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      local_1d8 = local_1d8 + sVar7;
    }
    else {
      local_1d0 = local_f0 + local_c4;
      iVar5 = memcmp(local_1d0,local_60,(size_t)local_1d8);
      if (iVar5 != 0) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81fa,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         in_stack_fffffffffffffce0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                         (BYTE *)CONCAT17(uVar10,in_stack_fffffffffffffcd0),
                         in_stack_fffffffffffffcc8);
      local_1d8 = local_1d8 + sVar7;
      if ((BYTE *)(ulong)local_f4 <= local_1d8 + local_c4) {
        local_1d0 = local_a0 + local_c4;
      }
    }
    if (local_180 < local_1d8) {
      if (local_12c <= local_c4) {
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8203,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((BYTE *)(ulong)(local_12c - local_c4) < local_1d8) {
        local_12c = local_c4 + (int)local_1d8;
      }
      local_180 = local_1d8;
      if (local_a4 == local_c4) {
        __assert_fail("(curr - matchIndex)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8207,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      local_48[(ulong)local_134 * 2] = (local_a4 - local_c4) + 3;
      local_48[(ulong)local_134 * 2 + 1] = (int)local_1d8;
      local_134 = local_134 + 1;
      if ((BYTE *)0x1000 < local_1d8 || local_60 + (long)local_1d8 == local_68) {
        if (local_6c == 2) {
          local_138 = 0;
        }
        break;
      }
    }
    if (local_1d0[(long)local_1d8] < local_60[(long)local_1d8]) {
      *local_120 = local_c4;
      local_e0 = local_1d8;
      if (local_c4 <= local_10c) {
        local_120 = &local_130;
        break;
      }
      local_120 = puVar8 + 1;
      local_c4 = puVar8[1];
    }
    else {
      *local_128 = local_c4;
      local_e8 = local_1d8;
      if (local_c4 <= local_10c) {
        local_128 = &local_130;
        break;
      }
      local_c4 = *puVar8;
      local_128 = puVar8;
    }
  }
  *local_128 = 0;
  *local_120 = 0;
  if (0x40000000 < local_138) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8221,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  if ((local_6c == 2) && (local_138 != 0)) {
    local_30 = local_60;
    local_38 = local_84;
    local_34 = uVar2;
    if (0x20 < uVar2) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    switch(local_84) {
    default:
      local_28 = ZSTD_hash4Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      break;
    case 5:
      local_28 = ZSTD_hash5Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      break;
    case 6:
      local_28 = ZSTD_hash6Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      break;
    case 7:
      local_28 = ZSTD_hash7Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      break;
    case 8:
      local_28 = ZSTD_hash8Ptr(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    }
    local_1e4 = local_2d8->hashTable[local_28];
    pUVar1 = local_2d8->chainTable;
    local_e8 = (BYTE *)0x0;
    local_e0 = (BYTE *)0x0;
    for (; local_138 != 0 && local_2f8 < local_1e4; local_138 = local_138 - 1) {
      pBVar9 = local_e8;
      if (local_e0 < local_e8) {
        pBVar9 = local_e0;
      }
      local_208 = local_2e8 + local_1e4;
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         in_stack_fffffffffffffce0,
                         (BYTE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                         (BYTE *)CONCAT17(uVar10,in_stack_fffffffffffffcd0),
                         in_stack_fffffffffffffcc8);
      pBVar9 = pBVar9 + sVar7;
      if ((BYTE *)(ulong)local_2f4 <= pBVar9 + local_1e4) {
        local_208 = local_a0 + (ulong)local_2fc + (ulong)local_1e4;
      }
      if (local_180 < pBVar9) {
        local_c4 = local_1e4 + local_2fc;
        if ((BYTE *)(ulong)(local_12c - local_c4) < pBVar9) {
          local_12c = local_c4 + (int)pBVar9;
        }
        if (local_a4 == local_c4) {
          __assert_fail("(curr - matchIndex)>0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8236,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        local_48[(ulong)local_134 * 2] = (local_a4 - local_c4) + 3;
        local_48[(ulong)local_134 * 2 + 1] = (int)pBVar9;
        local_134 = local_134 + 1;
        local_180 = pBVar9;
        if ((BYTE *)0x1000 < pBVar9 || local_60 + (long)pBVar9 == local_68) break;
      }
      if (local_1e4 <= uVar11) break;
      if (local_208[(long)pBVar9] < local_60[(long)pBVar9]) {
        local_1e4 = (pUVar1 + ((local_1e4 & local_308) << 1))[1];
        local_e0 = pBVar9;
      }
      else {
        local_1e4 = pUVar1[(local_1e4 & local_308) << 1];
        local_e8 = pBVar9;
      }
    }
  }
  if (local_a4 + 8 < local_12c) {
    local_50->nextToUpdate = local_12c - 8;
    return local_134;
  }
  __assert_fail("matchEndIdx > curr+8",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8248,
                "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
               );
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}